

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  byte bVar1;
  sqlite3 *db;
  CollSeq *pCVar2;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *p_Var3;
  u8 uVar4;
  undefined7 uVar5;
  sqlite3 *psVar6;
  char *pcVar7;
  Mem *pMem;
  void *pvVar8;
  CollSeq *pCVar9;
  CollSeq *pCVar10;
  long lVar11;
  
  db = pParse->db;
  if (pColl == (CollSeq *)0x0) {
    psVar6 = db;
    if (zName != (char *)0x0) {
      psVar6 = (sqlite3 *)findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
    }
    pColl = psVar6->pDfltColl + ((ulong)enc - 1);
    if (pColl != (CollSeq *)0x0 && psVar6->pDfltColl != (CollSeq *)0x0) goto LAB_0015800e;
  }
  else {
LAB_0015800e:
    if (pColl->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
      return pColl;
    }
  }
  if (db->xCollNeeded != (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0) {
    pcVar7 = sqlite3DbStrDup(db,zName);
    if (pcVar7 == (char *)0x0) goto LAB_001580f4;
    (*db->xCollNeeded)(db->pCollNeededArg,db,(uint)enc,pcVar7);
    sqlite3DbFreeNN(db,pcVar7);
  }
  if (db->xCollNeeded16 != (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)0x0) {
    pMem = (Mem *)sqlite3DbMallocRawNN(db,0x38);
    if (pMem != (Mem *)0x0) {
      (pMem->u).r = 0.0;
      pMem->flags = 0;
      pMem->enc = '\0';
      pMem->eSubtype = '\0';
      pMem->n = 0;
      pMem->szMalloc = 0;
      pMem->uTemp = 0;
      pMem->db = (sqlite3 *)0x0;
      pMem->z = (char *)0x0;
      pMem->zMalloc = (char *)0x0;
      pMem->xDel = (_func_void_void_ptr *)0x0;
      pMem->flags = 1;
      pMem->db = db;
      sqlite3VdbeMemSetStr(pMem,zName,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    pvVar8 = sqlite3ValueText(pMem,'\x02');
    if (pvVar8 != (void *)0x0) {
      (*db->xCollNeeded16)(db->pCollNeededArg,db,(int)db->enc,pvVar8);
    }
    sqlite3ValueFree(pMem);
  }
LAB_001580f4:
  psVar6 = db;
  if (zName != (char *)0x0) {
    psVar6 = (sqlite3 *)findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
  }
  pCVar2 = psVar6->pDfltColl;
  pCVar10 = pCVar2 + ((ulong)enc - 1);
  if (pCVar10 != (CollSeq *)0x0 && pCVar2 != (CollSeq *)0x0) {
    if (pCVar2[(ulong)enc - 1].xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
      return pCVar10;
    }
    pcVar7 = pCVar10->zName;
    lVar11 = 0;
    do {
      bVar1 = (&synthCollSeq_aEnc)[lVar11];
      psVar6 = db;
      if (pcVar7 != (char *)0x0) {
        psVar6 = (sqlite3 *)findElementWithHash(&db->aCollSeq,pcVar7,(uint *)0x0);
      }
      pCVar9 = psVar6->pDfltColl + ((ulong)bVar1 - 1);
      if (psVar6->pDfltColl == (CollSeq *)0x0) {
        pCVar9 = (CollSeq *)0x0;
      }
      if (pCVar9->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
        pcVar7 = pCVar9->zName;
        uVar4 = pCVar9->enc;
        uVar5 = *(undefined7 *)&pCVar9->field_0x9;
        p_Var3 = pCVar9->xCmp;
        pCVar2[(ulong)enc - 1].pUser = pCVar9->pUser;
        pCVar2[(ulong)enc - 1].xCmp = p_Var3;
        pCVar10->zName = pcVar7;
        pCVar2[(ulong)enc - 1].enc = uVar4;
        *(undefined7 *)&pCVar2[(ulong)enc - 1].field_0x9 = uVar5;
        pCVar2[(ulong)enc - 1].xDel = (_func_void_void_ptr *)0x0;
        return pCVar10;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
  }
  sqlite3ErrorMsg(pParse,"no such collation sequence: %s",zName);
  pParse->rc = 0x101;
  return (CollSeq *)0x0;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
    pParse->rc = SQLITE_ERROR_MISSING_COLLSEQ;
  }
  return p;
}